

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::SReadMemTask::checkArguments
          (SReadMemTask *this,ASTContext *context,Args *args,SourceRange range,Expression *param_5)

{
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  ASTContext *pAVar2;
  SystemSubroutine *in_RCX;
  Args *in_RDX;
  undefined8 in_RSI;
  undefined1 isMethod;
  ASTContext *in_RDI;
  SourceLocation in_R8;
  size_t in_stack_00000010;
  size_t in_stack_00000018;
  size_t i;
  Compilation *comp;
  Type *pTVar3;
  Type *this_01;
  ASTContext *in_stack_ffffffffffffffa8;
  ASTContext *pAVar4;
  ASTContext *context_00;
  SourceLocation in_stack_fffffffffffffff8;
  
  isMethod = (undefined1)((ulong)in_RSI >> 0x38);
  pAVar4 = in_RDI;
  this_00 = ASTContext::getCompilation((ASTContext *)0x93ecaf);
  pTVar3 = (Type *)0x4;
  this_01 = (Type *)0x7fffffff;
  callRange.endLoc = in_stack_fffffffffffffff8;
  callRange.startLoc = in_R8;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_RCX,pAVar4,(bool)isMethod,in_RDX,callRange,in_stack_00000010,
                     in_stack_00000018);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x93ed34);
    bVar1 = Type::isUnpackedArray(pTVar3);
    if (bVar1) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,1);
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x93ed93)
      ;
      bVar1 = Type::isNumeric(this_01);
      if (bVar1) {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,2)
        ;
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0x93edf2);
        bVar1 = Type::isNumeric(this_01);
        if (bVar1) {
          pAVar4 = (ASTContext *)0x3;
          while (context_00 = pAVar4,
                pAVar2 = (ASTContext *)
                         std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
                         size((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                              0x93ee53), pAVar4 < pAVar2) {
            std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                      (in_RDX,(size_type)context_00);
            not_null<const_slang::ast::Type_*>::operator->
                      ((not_null<const_slang::ast::Type_*> *)0x93ee7b);
            bVar1 = Type::canBeStringLike(this_01);
            if (!bVar1) {
              std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                        (in_RDX,(size_type)context_00);
              pTVar3 = SystemSubroutine::badArg(in_RCX,context_00,(Expression *)in_RDI);
              return pTVar3;
            }
            pAVar4 = (ASTContext *)((long)&(context_00->scope).ptr + 1);
          }
          pTVar3 = Compilation::getVoidType(this_00);
        }
        else {
          std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                    (in_RDX,2);
          pTVar3 = SystemSubroutine::badArg(in_RCX,in_stack_ffffffffffffffa8,(Expression *)in_RDI);
        }
      }
      else {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,1)
        ;
        pTVar3 = SystemSubroutine::badArg(in_RCX,in_stack_ffffffffffffffa8,(Expression *)in_RDI);
      }
    }
    else {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,1);
      pTVar3 = SystemSubroutine::badArg(in_RCX,in_stack_ffffffffffffffa8,(Expression *)in_RDI);
    }
  }
  else {
    pTVar3 = Compilation::getErrorType(this_00);
  }
  return pTVar3;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 4, INT32_MAX))
            return comp.getErrorType();

        if (!args[0]->type->isUnpackedArray())
            return badArg(context, *args[1]);

        if (!args[1]->type->isNumeric())
            return badArg(context, *args[1]);

        if (!args[2]->type->isNumeric())
            return badArg(context, *args[2]);

        for (size_t i = 3; i < args.size(); i++) {
            if (!args[i]->type->canBeStringLike())
                return badArg(context, *args[i]);
        }

        return comp.getVoidType();
    }